

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

Str tl::toUtf8(CStr32 o)

{
  char32_t cVar1;
  byte bVar2;
  u32 size_00;
  char32_t *pcVar3;
  byte *pbVar4;
  char32_t *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  StrT<char> *this;
  Str SVar6;
  CStr32 str_00;
  char32_t c;
  char32_t *__end1;
  char32_t *__begin1;
  CStr32 *__range1;
  u32 j;
  undefined1 auStack_20 [4];
  u32 size;
  CStr32 o_local;
  Str *str;
  
  this = o._0_8_;
  auStack_20 = o._str._0_4_;
  str_00._str = in_RDX;
  str_00._0_8_ = in_RDX;
  o_local._str = (char32_t *)this;
  size_00 = calcSizeUtf8((tl *)(ulong)(uint)auStack_20,str_00);
  StrT<char>::StrT(this,size_00,'.');
  __range1._0_4_ = 0;
  __end1 = CStrT<char32_t>::begin((CStrT<char32_t> *)auStack_20);
  pcVar3 = CStrT<char32_t>::end((CStrT<char32_t> *)auStack_20);
  uVar5 = extraout_RDX;
  for (; __end1 != pcVar3; __end1 = __end1 + 1) {
    cVar1 = *__end1;
    bVar2 = (byte)cVar1;
    if ((uint)cVar1 < 0x80) {
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1);
      *pbVar4 = bVar2 & 0x7f;
      __range1._0_4_ = (u32)__range1 + 1;
      uVar5 = extraout_RDX_00;
    }
    else if ((uint)cVar1 < 0x800) {
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 1);
      *pbVar4 = bVar2 & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1);
      *pbVar4 = (byte)((uint)cVar1 >> 6) & 0x1f | 0xc0;
      __range1._0_4_ = (u32)__range1 + 2;
      uVar5 = extraout_RDX_01;
    }
    else if ((uint)cVar1 < 0x10000) {
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 2);
      *pbVar4 = bVar2 & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 1);
      *pbVar4 = (byte)((uint)cVar1 >> 6) & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1);
      *pbVar4 = (byte)((uint)cVar1 >> 0xc) & 0xf | 0xe0;
      __range1._0_4_ = (u32)__range1 + 3;
      uVar5 = extraout_RDX_02;
    }
    else {
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 3);
      *pbVar4 = bVar2 & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 2);
      *pbVar4 = (byte)((uint)cVar1 >> 6) & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1 + 1);
      *pbVar4 = (byte)((uint)cVar1 >> 0xc) & 0x3f | 0x80;
      pbVar4 = (byte *)StrT<char>::operator[](this,(u32)__range1);
      *pbVar4 = (byte)((uint)cVar1 >> 0x12) & 7 | 0xf0;
      __range1._0_4_ = (u32)__range1 + 4;
      uVar5 = extraout_RDX_03;
    }
  }
  SVar6._8_8_ = uVar5;
  SVar6._str = (char *)this;
  return SVar6;
}

Assistant:

Str toUtf8(CStr32 o)
{
    const u32 size = calcSizeUtf8(o);
    Str str(size);
    u32 j = 0;
    for(char32_t c : o) {
        if(c < 0x80) {
            str[j] = c & 0b0111'1111;
            j += 1;
        }
        else if(c < 0x800) {
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1100'0000 | (0b1'1111 & c);
            j += 2;
        }
        else if(c < 0x10000) {
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1110'0000 | (0b1111 & c);
            j += 3;
        }
        else {
            str[j+3] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1111'0000 | (0b111 & c);
            j += 4;
        }
    }
    return str;
}